

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O1

lu_int basiclu_obj_update(basiclu_object *obj,double xtbl)

{
  lu_int lVar1;
  
  lVar1 = -8;
  if (((obj != (basiclu_object *)0x0) && (obj->istore != (lu_int *)0x0)) &&
     (obj->xstore != (double *)0x0)) {
    do {
      lVar1 = basiclu_update(obj->istore,obj->xstore,obj->Li,obj->Lx,obj->Ui,obj->Ux,obj->Wi,obj->Wx
                             ,xtbl);
      if (lVar1 != 1) {
        return lVar1;
      }
      lVar1 = lu_realloc_obj(obj);
    } while (lVar1 == 0);
  }
  return lVar1;
}

Assistant:

lu_int basiclu_obj_update(struct basiclu_object *obj, double xtbl)
{
    lu_int status = BASICLU_OK;

    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    while (status == BASICLU_OK)
    {
        status = basiclu_update(obj->istore, obj->xstore, obj->Li, obj->Lx,
                                obj->Ui, obj->Ux, obj->Wi, obj->Wx, xtbl);
        if (status != BASICLU_REALLOCATE)
            break;
        status = lu_realloc_obj(obj);
    }

    return status;
}